

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void PPrintText(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  int ixWS_00;
  uint uVar2;
  ushort **ppuVar3;
  int ixWS;
  int ixNL;
  uint c;
  uint ix;
  uint end;
  uint start;
  Node *node_local;
  uint indent_local;
  uint mode_local;
  TidyDocImpl *doc_local;
  
  ix = node->start;
  c = node->end;
  ixWS = 0;
  _end = node;
  node_local._0_4_ = indent;
  node_local._4_4_ = mode;
  _indent_local = doc;
  iVar1 = TextEndsWithNewline(doc->lexer,node,mode);
  ixWS_00 = TextStartsWithWhitespace(_indent_local->lexer,_end,ix,node_local._4_4_);
  if (0 < iVar1) {
    c = c - iVar1;
  }
  ixNL = IncrWS(ix,c,(uint)node_local,ixWS_00);
  ix = ixNL;
  for (; (uint)ixNL < c; ixNL = ixNL + 1) {
    CheckWrapIndent(_indent_local,(uint)node_local);
    ixWS = (int)(byte)_indent_local->lexer->lexbuf[(uint)ixNL];
    if (0x7f < (uint)ixWS) {
      uVar2 = prvTidyGetUTF8(_indent_local->lexer->lexbuf + (uint)ixNL,(uint *)&ixWS);
      ixNL = uVar2 + ixNL;
    }
    if (ixWS == 10) {
      prvTidyPFlushLine(_indent_local,(uint)node_local);
      iVar1 = TextStartsWithWhitespace(_indent_local->lexer,_end,ixNL + 1,node_local._4_4_);
      ixNL = IncrWS(ixNL,c,(uint)node_local,iVar1);
    }
    else if (((ixWS == 0x26) && (iVar1 = prvTidyHTMLVersion(_indent_local), iVar1 == 0x20000)) &&
            ((ixNL + 1U == c ||
             ((ixNL + 1U < c &&
              (ppuVar3 = __ctype_b_loc(),
              ((*ppuVar3)[(int)(uint)(byte)_indent_local->lexer->lexbuf[ixNL + 1]] & 0x2000) != 0)))
             ))) {
      PPrintChar(_indent_local,ixWS,node_local._4_4_ | 0x10);
    }
    else {
      PPrintChar(_indent_local,ixWS,node_local._4_4_);
    }
  }
  return;
}

Assistant:

static void PPrintText( TidyDocImpl* doc, uint mode, uint indent,
                        Node* node  )
{
    uint start = node->start;
    uint end = node->end;
    uint ix, c = 0;
    int  ixNL = TextEndsWithNewline( doc->lexer, node, mode );
    int  ixWS = TextStartsWithWhitespace( doc->lexer, node, start, mode );
    if ( ixNL > 0 )
      end -= ixNL;
    start = IncrWS( start, end, indent, ixWS );

    for ( ix = start; ix < end; ++ix )
    {
        CheckWrapIndent( doc, indent );
        /*
        if ( CheckWrapIndent(doc, indent) )
        {
            ixWS = TextStartsWithWhitespace( doc->lexer, node, ix );
            ix = IncrWS( ix, end, indent, ixWS );
        }
        */
        c = (byte) doc->lexer->lexbuf[ix];

        /* look for UTF-8 multibyte character */
        if ( c > 0x7F )
             ix += TY_(GetUTF8)( doc->lexer->lexbuf + ix, &c );

        if ( c == '\n' )
        {
            TY_(PFlushLine)( doc, indent );
            ixWS = TextStartsWithWhitespace( doc->lexer, node, ix+1, mode );
            ix = IncrWS( ix, end, indent, ixWS );
        }
        else if (( c == '&' ) && (TY_(HTMLVersion)(doc) == HT50) &&
            (((ix + 1) == end) || (((ix + 1) < end) && (isspace(doc->lexer->lexbuf[ix+1] & 0xff)))) )
        {
            /*\
             * Issue #207 - This is an unambiguous ampersand need not be 'quoted' in HTML5
             * Issue #379 - Ensure only 0 to 255 passed to 'isspace' to avoid debug assert
            \*/
            PPrintChar( doc, c, (mode | CDATA) );
        }
        else
        {
            PPrintChar( doc, c, mode );
        }
    }
}